

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O3

iterator_range<burst::bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
burst::bitap<unsigned_short,std::__cxx11::string,std::__cxx11::string>
          (iterator_range<burst::bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,burst *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pattern,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_> bitap;
  bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  undefined4 local_9e;
  ushort local_9a;
  boost local_98 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  char *pcStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  algorithm::bitap<char,unsigned_short,std::array<unsigned_short,256ul>>::
  bitap<std::__cxx11::string>
            ((bitap<char,unsigned_short,std::array<unsigned_short,256ul>> *)&local_28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  local_68 = local_28;
  local_60 = local_20;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_20->_M_use_count = local_20->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_20->_M_use_count = local_20->_M_use_count + 1;
    }
  }
  make_bitap_iterator<char,unsigned_short,std::array<unsigned_short,256ul>,std::__cxx11::string>
            (&local_d0,(burst *)&local_68,
             (bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_> *)pattern,local_28);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  this_00._M_pi =
       local_d0.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_58.m_bitap.m_bitmask_table.
  super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_d0.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_d0.m_bitap.m_bitmask_table.
      super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_58.m_bitap.m_bitmask_table.
    super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_001fa859;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_d0.m_bitap.m_bitmask_table.
     super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi)->_M_use_count =
         (local_d0.m_bitap.m_bitmask_table.
          super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi)->_M_use_count + 1;
    UNLOCK();
    if (local_d0.m_bitap.m_bitmask_table.
        super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded != '\0') goto LAB_001fa7f8;
      LOCK();
      (local_d0.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_d0.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d0.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_d0.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
      goto LAB_001fa859;
    }
  }
  else {
    (local_d0.m_bitap.m_bitmask_table.
     super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi)->_M_use_count =
         (local_d0.m_bitap.m_bitmask_table.
          super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi)->_M_use_count + 1;
LAB_001fa7f8:
    (local_d0.m_bitap.m_bitmask_table.
     super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi)->_M_use_count =
         (local_d0.m_bitap.m_bitmask_table.
          super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi)->_M_use_count + 1;
  }
  local_90 = local_d0.m_bitap.m_bitmask_table.
             super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  (local_d0.m_bitap.m_bitmask_table.
   super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count =
       (local_d0.m_bitap.m_bitmask_table.
        super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi)->_M_use_count + 1;
  local_58.m_bitap.m_bitmask_table.
  super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_90;
LAB_001fa859:
  local_58.m_hint = 0;
  local_58._18_4_ = local_9e;
  local_58._22_2_ = local_9a;
  local_58.m_match.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = local_d0.m_text_end._M_current;
  local_58.m_match.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = local_d0.m_text_end._M_current;
  local_58.m_text_end._M_current = local_d0.m_text_end._M_current;
  local_90 = local_58.m_bitap.m_bitmask_table.
             super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  pcStack_70 = local_58.m_match.
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_current;
  boost::
  make_iterator_range<burst::bitap_iterator<burst::algorithm::bitap<char,unsigned_short,std::array<unsigned_short,256ul>>,std::__cxx11::string>>
            (__return_storage_ptr__,local_98,&local_58,
             (bitap_iterator<burst::algorithm::bitap<char,_unsigned_short,_std::array<unsigned_short,_256UL>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(ulong)local_9a);
  if (local_58.m_bitap.m_bitmask_table.
      super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.m_bitap.m_bitmask_table.
               super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (local_d0.m_bitap.m_bitmask_table.
      super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_bitap.m_bitmask_table.
               super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::array<unsigned_short,_256UL>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

auto bitap (const ForwardRange1 & pattern, const ForwardRange2 & text)
    {
        auto bitap = algorithm::make_bitap<Bitmask>(pattern);
        auto begin = make_bitap_iterator(std::move(bitap), text);
        auto end = make_bitap_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }